

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_a.c
# Opt level: O0

void test_option_a(void)

{
  char *pcVar1;
  wchar_t unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  wchar_t in_stack_00000014;
  char *p;
  size_t s;
  void *in_stack_00000028;
  char *in_stack_00000030;
  void *in_stack_00000038;
  wchar_t in_stack_00000044;
  char *in_stack_00000048;
  size_t in_stack_00000060;
  char *in_stack_00000068;
  void *in_stack_00000070;
  char *in_stack_00000488;
  wchar_t in_stack_00000494;
  char *in_stack_00000498;
  void *pvVar2;
  char *in_stack_ffffffffffffffe0;
  char *pcVar3;
  longlong in_stack_ffffffffffffffe8;
  longlong lVar4;
  undefined8 in_stack_fffffffffffffff0;
  wchar_t wVar5;
  char *in_stack_fffffffffffffff8;
  
  wVar5 = (wchar_t)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  assertion_make_file(p,in_stack_00000014,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                      in_stack_fffffffffffffff8);
  systemf("%s -acf test1.tar.Z f 2>test1.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,in_stack_ffffffffffffffe8,
                      in_stack_ffffffffffffffe0,0,(char *)0x110754,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test1.tar.Z");
  assertion_assert(pcVar1,(wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be compressed");
  pcVar3 = "2";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s -acf test2.taZ f 2>test2.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x11084e,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test2.taZ");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be compressed");
  pcVar3 = "2";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s -acf test3.tar.Z.uu f 2>test3.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x110948,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test3.tar.Z.uu");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be uuencoded");
  pcVar3 = "12";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s -acf test4.zip f 2>test4.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x110a42,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test4.zip");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be zipped");
  pcVar3 = "4";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s -acf test5.tar.Z --uuencode f 2>test5.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x110b3c,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test5.tar.Z");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be compressed, ignoring --uuencode option");
  pcVar3 = "2";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s -acf test6.xxx --uuencode f 2>test6.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x110c36,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test6.xxx");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  wVar5 = (wchar_t)((ulong)pcVar1 >> 0x20);
  failure("The archive should be uuencoded");
  pcVar3 = "12";
  lVar4 = 0;
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  systemf("%s --auto-compress -cf test7.tar.Z f 2>test7.err",testprog);
  pvVar2 = (void *)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,wVar5,lVar4,pcVar3,0,(char *)0x110d30,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  pcVar1 = slurpfile((size_t *)&stack0xfffffffffffffff8,"test7.tar.Z");
  assertion_assert(pcVar1,(wchar_t)((ulong)lVar4 >> 0x20),(wchar_t)lVar4,pcVar3,pvVar2);
  failure("The archive should be compressed");
  assertion_equal_mem(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,(char *)s,in_stack_00000060,in_stack_00000068,
                      in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_option_a)
{
	size_t s;
	char *p;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Test1: archive it with .tar.Z suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test1.tar.Z f 2>test1.err", testprog));
	assertEmptyFile("test1.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test1.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test2: archive it with .taZ suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test2.taZ f 2>test2.err", testprog));
	assertEmptyFile("test2.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test2.taZ");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test3: archive it with .tar.Z.uu suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test3.tar.Z.uu f 2>test3.err", testprog));
	assertEmptyFile("test3.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test3.tar.Z.uu");
	assert(s > 12);
	failure("The archive should be uuencoded");
	assertEqualMem(p, "begin 644 -\n", 12);

	/* Test4: archive it with .zip suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test4.zip f 2>test4.err", testprog));
	assertEmptyFile("test4.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test4.zip");
	assert(s > 4);
	failure("The archive should be zipped");
	assertEqualMem(p, "\x50\x4b\x03\x04", 4);

	/* Test5: archive it with .tar.Z suffix and --uuencode option. */
	assertEqualInt(0,
	    systemf("%s -acf test5.tar.Z --uuencode f 2>test5.err",
		testprog));
	assertEmptyFile("test5.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test5.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed, ignoring --uuencode option");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test6: archive it with .xxx suffix(unknown suffix) and
	 * --uuencode option. */
	assertEqualInt(0,
	    systemf("%s -acf test6.xxx --uuencode f 2>test6.err",
		testprog));
	assertEmptyFile("test6.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test6.xxx");
	assert(s > 12);
	failure("The archive should be uuencoded");
	assertEqualMem(p, "begin 644 -\n", 12);

	/* Test7: archive it with .tar.Z suffix using a long-name option. */
	assertEqualInt(0,
	    systemf("%s --auto-compress -cf test7.tar.Z f 2>test7.err",
		testprog));
	assertEmptyFile("test7.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test7.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);
}